

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O0

bool __thiscall
OSSLRSA::generateKeyPair
          (OSSLRSA *this,AsymmetricKeyPair **ppKeyPair,AsymmetricParameters *parameters,RNG *param_4
          )

{
  uint uVar1;
  int iVar2;
  ByteString *this_00;
  ByteString *pBVar3;
  size_t sVar4;
  ulong uVar5;
  unsigned_long uVar6;
  OSSLRSAKeyPair *r;
  BIGNUM *e_00;
  long *__s;
  long *plVar7;
  RSAParameters *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  OSSLRSAKeyPair *kp;
  BIGNUM *bn_e;
  RSA *rsa;
  unsigned_long e;
  RSAParameters *params;
  ByteString *in_stack_ffffffffffffff68;
  size_t __n;
  OSSLRSAKeyPair *this_01;
  
  if ((in_RSI != (undefined8 *)0x0) && (in_RDX != (RSAParameters *)0x0)) {
    uVar1 = (*(in_RDX->super_AsymmetricParameters).super_Serialisable._vptr_Serialisable[3])
                      (in_RDX,RSAParameters::type);
    if ((uVar1 & 1) == 0) {
      softHSMLog(3,"generateKeyPair",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x54a,"Invalid parameters supplied for RSA key generation");
    }
    else {
      this_00 = (ByteString *)RSAParameters::getBitLength(in_RDX);
      pBVar3 = (ByteString *)(**(code **)(*in_RDI + 0x68))();
      if (pBVar3 <= this_00) {
        sVar4 = RSAParameters::getBitLength(in_RDX);
        uVar5 = (**(code **)(*in_RDI + 0x70))();
        if (sVar4 <= uVar5) {
          sVar4 = RSAParameters::getBitLength(in_RDX);
          if (sVar4 < 0x400) {
            softHSMLog(4,"generateKeyPair",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                       ,0x55a,"Using an RSA key size < 1024 bits is not recommended");
          }
          RSAParameters::getE(in_RDX);
          uVar6 = ByteString::long_val(this_00);
          if ((uVar6 == 0) || ((uVar6 & 1) != 1)) {
            softHSMLog(3,"generateKeyPair",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                       ,0x563,"Invalid RSA public exponent %d",uVar6);
            return false;
          }
          r = (OSSLRSAKeyPair *)RSA_new();
          if (r == (OSSLRSAKeyPair *)0x0) {
            softHSMLog(3,"generateKeyPair",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                       ,0x56c,"Failed to instantiate OpenSSL RSA object");
            return false;
          }
          RSAParameters::getE(in_RDX);
          e_00 = (BIGNUM *)OSSL::byteString2bn(in_stack_ffffffffffffff68);
          this_01 = r;
          sVar4 = RSAParameters::getBitLength(in_RDX);
          iVar2 = RSA_generate_key_ex((RSA *)this_01,(int)sVar4,e_00,(BN_GENCB *)0x0);
          if (iVar2 != 0) {
            BN_free(e_00);
            __n = 0x1b8;
            __s = (long *)operator_new(0x1b8);
            memset(__s,0,__n);
            OSSLRSAKeyPair::OSSLRSAKeyPair(this_01);
            plVar7 = (long *)(**(code **)(*__s + 0x18))();
            (**(code **)(*plVar7 + 0x58))(plVar7,r);
            plVar7 = (long *)(**(code **)(*__s + 0x28))();
            (**(code **)(*plVar7 + 200))(plVar7,r);
            *in_RSI = __s;
            RSA_free((RSA *)r);
            return true;
          }
          uVar5 = ERR_get_error();
          softHSMLog(3,"generateKeyPair",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x576,"RSA key generation failed (0x%08X)",uVar5);
          BN_free(e_00);
          RSA_free((RSA *)r);
          return false;
        }
      }
      sVar4 = RSAParameters::getBitLength(in_RDX);
      softHSMLog(3,"generateKeyPair",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x553,"This RSA key size (%lu) is not supported",sVar4);
    }
  }
  return false;
}

Assistant:

bool OSSLRSA::generateKeyPair(AsymmetricKeyPair** ppKeyPair, AsymmetricParameters* parameters, RNG* /*rng = NULL */)
{
	// Check parameters
	if ((ppKeyPair == NULL) ||
	    (parameters == NULL))
	{
		return false;
	}

	if (!parameters->areOfType(RSAParameters::type))
	{
		ERROR_MSG("Invalid parameters supplied for RSA key generation");

		return false;
	}

	RSAParameters* params = (RSAParameters*) parameters;

	if (params->getBitLength() < getMinKeySize() || params->getBitLength() > getMaxKeySize())
	{
		ERROR_MSG("This RSA key size (%lu) is not supported", params->getBitLength());

		return false;
	}

	if (params->getBitLength() < 1024)
	{
		WARNING_MSG("Using an RSA key size < 1024 bits is not recommended");
	}

	// Retrieve the desired public exponent
	unsigned long e = params->getE().long_val();

	// Check the public exponent
	if ((e == 0) || (e % 2 != 1))
	{
		ERROR_MSG("Invalid RSA public exponent %d", e);

		return false;
	}

	// Generate the key-pair
	RSA* rsa = RSA_new();
	if (rsa == NULL)
	{
		ERROR_MSG("Failed to instantiate OpenSSL RSA object");

		return false;
	}

	BIGNUM* bn_e = OSSL::byteString2bn(params->getE());

	// Check if the key was successfully generated
	if (!RSA_generate_key_ex(rsa, params->getBitLength(), bn_e, NULL))
	{
		ERROR_MSG("RSA key generation failed (0x%08X)", ERR_get_error());
		BN_free(bn_e);
		RSA_free(rsa);

		return false;
	}
	BN_free(bn_e);

	// Create an asymmetric key-pair object to return
	OSSLRSAKeyPair* kp = new OSSLRSAKeyPair();

	((OSSLRSAPublicKey*) kp->getPublicKey())->setFromOSSL(rsa);
	((OSSLRSAPrivateKey*) kp->getPrivateKey())->setFromOSSL(rsa);

	*ppKeyPair = kp;

	// Release the key
	RSA_free(rsa);

	return true;
}